

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O0

void __thiscall dap::Error::Error(Error *this,char *msg,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_8f8 [16];
  undefined8 local_8e8;
  undefined8 local_8e0;
  undefined8 local_8d8;
  undefined8 local_8d0;
  undefined8 local_8c8;
  undefined8 local_8b8;
  undefined8 local_8a8;
  undefined8 local_898;
  undefined8 local_888;
  undefined8 local_878;
  undefined8 local_868;
  undefined8 local_858;
  undefined4 local_838;
  undefined4 local_834;
  va_list vararg;
  char local_818 [8];
  char buf [2048];
  char *msg_local;
  Error *this_local;
  
  if (in_AL != '\0') {
    local_8c8 = in_XMM0_Qa;
    local_8b8 = in_XMM1_Qa;
    local_8a8 = in_XMM2_Qa;
    local_898 = in_XMM3_Qa;
    local_888 = in_XMM4_Qa;
    local_878 = in_XMM5_Qa;
    local_868 = in_XMM6_Qa;
    local_858 = in_XMM7_Qa;
  }
  local_8e8 = in_RDX;
  local_8e0 = in_RCX;
  local_8d8 = in_R8;
  local_8d0 = in_R9;
  buf._2040_8_ = msg;
  std::__cxx11::string::string((string *)this);
  vararg[0].overflow_arg_area = local_8f8;
  vararg[0]._0_8_ = &stack0x00000008;
  local_834 = 0x30;
  local_838 = 0x10;
  vsnprintf(local_818,0x800,(char *)buf._2040_8_,&local_838);
  std::__cxx11::string::operator=((string *)this,local_818);
  return;
}

Assistant:

Error::Error(const char* msg, ...) {
  char buf[2048];
  va_list vararg;
  va_start(vararg, msg);
  vsnprintf(buf, sizeof(buf), msg, vararg);
  va_end(vararg);
  message = buf;
}